

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_set_key(Tree *this,size_t node,csubstr key,type_bits more_flags)

{
  NodeData *pNVar1;
  size_t in_RCX;
  char *in_RDX;
  size_t in_RSI;
  Tree *in_RDI;
  type_bits in_R8;
  
  pNVar1 = _p(this,node);
  (pNVar1->m_key).scalar.str = in_RDX;
  (pNVar1->m_key).scalar.len = in_RCX;
  _add_flags(in_RDI,in_RSI,in_R8);
  return;
}

Assistant:

void _set_key(size_t node, csubstr key, type_bits more_flags=0)
    {
        _p(node)->m_key.scalar = key;
        _add_flags(node, KEY|more_flags);
    }